

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<VariableTypeRemap,_8UL>::reserve
          (SmallVector<VariableTypeRemap,_8UL> *this,size_t count)

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  VariableTypeRemap *pVVar5;
  undefined8 *puVar6;
  long *plVar7;
  VariableTypeRemap *pVVar8;
  long lVar9;
  ulong uVar10;
  
  if (count >> 0x3a == 0) {
    uVar4 = this->buffer_capacity;
    if (uVar4 < count) {
      uVar10 = 8;
      if (8 < uVar4) {
        uVar10 = uVar4;
      }
      do {
        uVar4 = uVar10;
        uVar10 = uVar4 * 2;
      } while (uVar4 < count);
      if (uVar4 < 9) {
        pVVar5 = (VariableTypeRemap *)&this->stack_storage;
      }
      else {
        pVVar5 = (VariableTypeRemap *)malloc(uVar4 << 6);
        if (pVVar5 == (VariableTypeRemap *)0x0) goto LAB_001a4b5e;
      }
      pVVar8 = (this->super_VectorView<VariableTypeRemap>).ptr;
      if ((pVVar5 != pVVar8) && ((this->super_VectorView<VariableTypeRemap>).buffer_size != 0)) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          pVVar8 = (this->super_VectorView<VariableTypeRemap>).ptr;
          pcVar2 = (char *)((long)&(pVVar5->variable_name)._M_dataplus._M_p + lVar9);
          *(char **)pcVar2 = pcVar2 + 0x10;
          puVar1 = (undefined8 *)((long)&(pVVar8->variable_name)._M_dataplus._M_p + lVar9);
          plVar7 = puVar1 + 2;
          if (plVar7 == (long *)*puVar1) {
            uVar3 = puVar1[3];
            *(long *)(pcVar2 + 0x10) = *plVar7;
            *(undefined8 *)(pcVar2 + 0x18) = uVar3;
          }
          else {
            pcVar2 = (char *)((long)&(pVVar5->variable_name)._M_dataplus._M_p + lVar9);
            *(long **)pcVar2 = (long *)*puVar1;
            *(long *)(pcVar2 + 0x10) = *plVar7;
          }
          puVar1 = (undefined8 *)((long)&(pVVar8->variable_name)._M_dataplus._M_p + lVar9);
          puVar6 = puVar1 + 6;
          pcVar2 = (pVVar5->new_variable_type).field_2._M_local_buf + lVar9;
          *(undefined8 *)(pcVar2 + -0x28) = puVar1[1];
          *puVar1 = plVar7;
          puVar1[1] = 0;
          *(undefined1 *)(puVar1 + 2) = 0;
          *(char **)(pcVar2 + -0x10) = pcVar2;
          if (puVar6 == (undefined8 *)puVar1[4]) {
            uVar3 = puVar1[7];
            *(undefined8 *)pcVar2 = *puVar6;
            *(undefined8 *)(pcVar2 + 8) = uVar3;
          }
          else {
            *(undefined8 **)((long)&(pVVar5->new_variable_type)._M_dataplus._M_p + lVar9) =
                 (undefined8 *)puVar1[4];
            *(undefined8 *)((long)&(pVVar5->new_variable_type).field_2 + lVar9) = *puVar6;
          }
          *(undefined8 *)((long)&(pVVar5->new_variable_type)._M_string_length + lVar9) =
               *(undefined8 *)((long)&(pVVar8->new_variable_type)._M_string_length + lVar9);
          *(undefined8 **)((long)&(pVVar8->new_variable_type)._M_dataplus._M_p + lVar9) = puVar6;
          *(undefined8 *)((long)&(pVVar8->new_variable_type)._M_string_length + lVar9) = 0;
          (pVVar8->new_variable_type).field_2._M_local_buf[lVar9] = '\0';
          pVVar8 = (this->super_VectorView<VariableTypeRemap>).ptr;
          pcVar2 = *(char **)((long)&(pVVar8->new_variable_type)._M_dataplus._M_p + lVar9);
          if ((pVVar8->new_variable_type).field_2._M_local_buf + lVar9 != pcVar2) {
            operator_delete(pcVar2);
          }
          puVar1 = (undefined8 *)((long)&(pVVar8->variable_name)._M_dataplus._M_p + lVar9);
          puVar6 = (undefined8 *)*puVar1;
          if (puVar1 + 2 != puVar6) {
            operator_delete(puVar6);
          }
          uVar10 = uVar10 + 1;
          lVar9 = lVar9 + 0x40;
        } while (uVar10 < (this->super_VectorView<VariableTypeRemap>).buffer_size);
        pVVar8 = (this->super_VectorView<VariableTypeRemap>).ptr;
      }
      if (pVVar8 != (VariableTypeRemap *)&this->stack_storage) {
        free(pVVar8);
      }
      (this->super_VectorView<VariableTypeRemap>).ptr = pVVar5;
      this->buffer_capacity = uVar4;
    }
    return;
  }
LAB_001a4b5e:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > std::numeric_limits<size_t>::max() / sizeof(T)) ||
		    (count > std::numeric_limits<size_t>::max() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}